

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gif.h
# Opt level: O3

int GifPickChangedPixels(uint8_t *lastFrame,uint8_t *frame,int numPixels)

{
  int iVar1;
  long lVar2;
  uint8_t *writeIter;
  uint8_t *puVar3;
  
  if (0 < numPixels) {
    lVar2 = 0;
    iVar1 = 0;
    puVar3 = frame;
    do {
      if (((lastFrame[lVar2 * 4] != frame[lVar2 * 4]) ||
          (lastFrame[lVar2 * 4 + 1] != frame[lVar2 * 4 + 1])) ||
         (lastFrame[lVar2 * 4 + 2] != frame[lVar2 * 4 + 2])) {
        *puVar3 = frame[lVar2 * 4];
        puVar3[1] = frame[lVar2 * 4 + 1];
        puVar3[2] = frame[lVar2 * 4 + 2];
        iVar1 = iVar1 + 1;
        puVar3 = puVar3 + 4;
      }
      lVar2 = lVar2 + 1;
    } while (numPixels != (int)lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int GifPickChangedPixels( const uint8_t* lastFrame, uint8_t* frame, int numPixels )
{
    int numChanged = 0;
    uint8_t* writeIter = frame;

    for (int ii=0; ii<numPixels; ++ii)
    {
        if(lastFrame[0] != frame[0] ||
           lastFrame[1] != frame[1] ||
           lastFrame[2] != frame[2])
        {
            writeIter[0] = frame[0];
            writeIter[1] = frame[1];
            writeIter[2] = frame[2];
            ++numChanged;
            writeIter += 4;
        }
        lastFrame += 4;
        frame += 4;
    }

    return numChanged;
}